

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::
SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
::Verify(SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
         *this)

{
  RecyclerVerifyListConsistencyData *in_R8;
  anon_class_16_2_364abe19 fn;
  undefined1 local_30 [8];
  RecyclerVerifyListConsistencyData recyclerVerifyListConsistencyData;
  
  SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
  Verify(&this->
          super_SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
        );
  recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.expectFull = false;
  recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.expectDispose = false;
  recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData.
  hasSetupVerifyListConsistencyData = false;
  recyclerVerifyListConsistencyData.smallBlockVerifyListConsistencyData._3_5_ = 0;
  local_30._0_2_ = 0x100;
  local_30[2] = 1;
  fn.recyclerVerifyListConsistencyData = in_R8;
  fn.this = (SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
             *)local_30;
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::Verify()::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->pendingDisposeList,
             (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)this,fn);
  return;
}

Assistant:

void
SmallFinalizableHeapBucketBaseT<TBlockType>::Verify()
{
    BaseT::Verify();

#if DBG
    RecyclerVerifyListConsistencyData recyclerVerifyListConsistencyData;
    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        recyclerVerifyListConsistencyData.SetupVerifyListConsistencyDataForSmallBlock(nullptr, false, true);
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        recyclerVerifyListConsistencyData.SetupVerifyListConsistencyDataForMediumBlock(nullptr, false, true);
    }
    else
    {
        Assert(false);
    }

    HeapBlockList::ForEach(this->pendingDisposeList, [this, &recyclerVerifyListConsistencyData](TBlockType * heapBlock)
    {
        DebugOnly(this->VerifyBlockConsistencyInList(heapBlock, recyclerVerifyListConsistencyData));
        heapBlock->Verify(true);
    });
#endif

}